

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O1

string_view __thiscall wabt::GetExtension(wabt *this,string_view filename)

{
  wabt *pwVar1;
  size_t sVar2;
  wabt *pwVar3;
  string_view sVar5;
  wabt *pwVar4;
  
  pwVar4 = this;
  if (this == (wabt *)0x0) {
LAB_00163954:
    pwVar3 = (wabt *)0xffffffffffffffff;
  }
  else {
    do {
      pwVar3 = pwVar4 + -1;
      if (pwVar4 == (wabt *)0x0) goto LAB_00163954;
      pwVar1 = pwVar4 + (filename._M_len - 1);
      pwVar4 = pwVar3;
    } while (*pwVar1 != (wabt)0x2e);
  }
  if (pwVar3 == (wabt *)0xffffffffffffffff) {
    pwVar3 = (wabt *)0x1d8861;
    sVar2 = 0;
  }
  else {
    sVar2 = (long)this - (long)pwVar3;
    if (this < pwVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    pwVar3 = pwVar3 + filename._M_len;
  }
  sVar5._M_str = (char *)pwVar3;
  sVar5._M_len = sVar2;
  return sVar5;
}

Assistant:

std::string_view GetExtension(std::string_view filename) {
  size_t pos = filename.find_last_of('.');
  if (pos == std::string_view::npos) {
    return "";
  }
  return filename.substr(pos);
}